

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O2

void Abs_ManSimInfoSet(Vec_Ptr_t *vSimInfo,Aig_Obj_t *pObj,int iFrame,int Value)

{
  uint *puVar1;
  uint uVar2;
  void *pvVar3;
  
  pvVar3 = Vec_PtrEntry(vSimInfo,iFrame);
  if (Value - 1U < 3) {
    uVar2 = Abs_ManSimInfoGet(vSimInfo,pObj,iFrame);
    puVar1 = (uint *)((long)pvVar3 + (long)(pObj->Id >> 4) * 4);
    *puVar1 = *puVar1 ^ (uVar2 ^ Value) << ((char)pObj->Id * '\x02' & 0x1fU);
    return;
  }
  __assert_fail("Value >= ABS_ZER && Value <= ABS_UND",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc2.c"
                ,0x8a,"void Abs_ManSimInfoSet(Vec_Ptr_t *, Aig_Obj_t *, int, int)");
}

Assistant:

static inline void Abs_ManSimInfoSet( Vec_Ptr_t * vSimInfo, Aig_Obj_t * pObj, int iFrame, int Value )
{
    unsigned * pInfo = (unsigned *)Vec_PtrEntry( vSimInfo, iFrame );
    assert( Value >= ABS_ZER && Value <= ABS_UND );
    Value ^= Abs_ManSimInfoGet( vSimInfo, pObj, iFrame );
    pInfo[Aig_ObjId(pObj) >> 4] ^= (Value << ((Aig_ObjId(pObj) & 15) << 1));
}